

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::_InternalParse
          (SoundAnalysisPreprocessing *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  SoundAnalysisPreprocessing_Vggish *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar4;
  Arena *arena;
  uint res;
  pair<const_char_*,_unsigned_int> pVar5;
  byte *local_30;
  
  local_30 = (byte *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar3) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_30;
      res = (uint)bVar1;
      pbVar4 = local_30 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar4 * 0x80) - 0x80;
        if ((char)*pbVar4 < '\0') {
          pVar5 = google::protobuf::internal::ReadTagFallback((char *)local_30,res);
          pbVar4 = (byte *)pVar5.first;
          res = pVar5.second;
        }
        else {
          pbVar4 = local_30 + 2;
        }
      }
      local_30 = pbVar4;
      if (res == 0xa2) {
        if (this->_oneof_case_[0] == 0x14) {
          msg = (this->SoundAnalysisPreprocessingType_).vggish_;
        }
        else {
          clear_SoundAnalysisPreprocessingType(this);
          this->_oneof_case_[0] = 0x14;
          uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
          arena = (Arena *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            arena = *(Arena **)arena;
          }
          msg = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish>
                          (arena);
          (this->SoundAnalysisPreprocessingType_).vggish_ = msg;
        }
        local_30 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                     (ctx,&msg->super_MessageLite,(char *)local_30);
      }
      else {
        if ((res == 0) || ((res & 7) == 4)) {
          if (pbVar4 == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar4;
        }
        uVar2 = this_00->ptr_;
        if ((uVar2 & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((uVar2 & 0xfffffffffffffffc) + 8);
        }
        local_30 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (res,unknown,(char *)local_30,ctx);
      }
      if (local_30 == (byte *)0x0) {
        return (char *)0x0;
      }
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_30;
}

Assistant:

const char* SoundAnalysisPreprocessing::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing.Vggish vggish = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          ptr = ctx->ParseMessage(_internal_mutable_vggish(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}